

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O3

SampledSpectrum __thiscall
pbrt::ConductorBxDF::f(ConductorBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode)

{
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  byte bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  Float FVar13;
  Float FVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  float fVar25;
  undefined1 auVar26 [64];
  float fVar27;
  undefined8 uVar28;
  undefined1 auVar29 [16];
  float fVar30;
  SampledSpectrum SVar31;
  Tuple3<pbrt::Vector3,_float> local_68;
  Tuple3<pbrt::Vector3,_float> local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  
  auVar26._4_60_ = wi._12_60_;
  auVar26._0_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar24._8_56_ = wi._8_56_;
  auVar24._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar22._4_60_ = wo._12_60_;
  auVar22._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar18._8_56_ = wo._8_56_;
  auVar18._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_58._0_8_ = vmovlps_avx(auVar18._0_16_);
  uVar15 = 0;
  local_68._0_8_ = vmovlps_avx(auVar24._0_16_);
  if ((((auVar22._0_4_ * auVar26._0_4_ <= 0.0) ||
       (auVar16 = vminss_avx(ZEXT416((uint)(this->mfDistrib).alpha_y),
                             ZEXT416((uint)(this->mfDistrib).alpha_x)), auVar16._0_4_ < 0.001)) ||
      ((auVar22._0_4_ == 0.0 && (!NAN(auVar22._0_4_))))) ||
     ((auVar26._0_4_ == 0.0 && (!NAN(auVar26._0_4_))))) {
    uVar28 = 0;
  }
  else {
    fVar30 = auVar22._0_4_ + auVar26._0_4_;
    auVar11._0_4_ =
         wi.super_Tuple3<pbrt::Vector3,_float>.x + wo.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar11._4_4_ =
         wi.super_Tuple3<pbrt::Vector3,_float>.y + wo.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar11._8_4_ =
         wi.super_Tuple3<pbrt::Vector3,_float>.z + wo.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar11._12_4_ = wi._12_4_ + wo._12_4_;
    auVar16 = vmovshdup_avx(auVar11);
    fVar27 = auVar16._0_4_;
    if (((fVar30 == 0.0) && (!NAN(fVar30))) && (auVar11._0_4_ == 0.0)) {
      uVar28 = 0;
      if ((fVar27 == 0.0) && (!NAN(fVar27))) goto LAB_00452676;
    }
    auVar16._8_4_ = 0x7fffffff;
    auVar16._0_8_ = 0x7fffffff7fffffff;
    auVar16._12_4_ = 0x7fffffff;
    local_18 = vandps_avx(auVar22._0_16_,auVar16);
    local_28 = vandps_avx(auVar26._0_16_,auVar16);
    auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar27 * fVar27)),auVar11,auVar11);
    auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)fVar30),ZEXT416((uint)fVar30));
    auVar16 = vsqrtss_avx(auVar16,auVar16);
    fVar27 = auVar16._0_4_;
    auVar19._4_4_ = fVar27;
    auVar19._0_4_ = fVar27;
    auVar19._8_4_ = fVar27;
    auVar19._12_4_ = fVar27;
    fVar30 = fVar30 / fVar27;
    auVar16 = vdivps_avx(auVar11,auVar19);
    auVar11 = vmovshdup_avx(auVar16);
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * 0.0)),auVar16,ZEXT816(0) << 0x40);
    fVar27 = fVar30 + auVar11._0_4_;
    auVar29 = auVar16;
    if (fVar27 < 0.0) {
      auVar29._0_8_ = auVar16._0_8_ ^ 0x8000000080000000;
      auVar29._8_4_ = auVar16._8_4_ ^ 0x80000000;
      auVar29._12_4_ = auVar16._12_4_ ^ 0x80000000;
    }
    uVar15 = vcmpss_avx512f(ZEXT416((uint)fVar27),ZEXT816(0) << 0x40,1);
    bVar3 = (bool)((byte)uVar15 & 1);
    auVar10._0_4_ = (uint)bVar3 * (int)-fVar30 + (uint)!bVar3 * (int)fVar30;
    auVar10._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar20._0_4_ = auVar29._0_4_ * wi.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar20._4_4_ = auVar29._4_4_ * wi.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar20._8_4_ = auVar29._8_4_ * wi.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar20._12_4_ = auVar29._12_4_ * wi._12_4_;
    auVar11 = vmovshdup_avx(auVar20);
    auVar11 = vfmadd231ss_fma(auVar11,auVar29,auVar24._0_16_);
    auVar11 = vfmadd231ss_fma(auVar11,auVar26._0_16_,auVar10);
    uVar15 = auVar11._8_8_;
    auVar4._8_4_ = 0x7fffffff;
    auVar4._0_8_ = 0x7fffffff7fffffff;
    auVar4._12_4_ = 0x7fffffff;
    auVar11 = vandps_avx512vl(auVar11,auVar4);
    uVar28 = auVar11._8_8_;
    local_68.z = auVar26._0_4_;
    local_58.z = auVar22._0_4_;
    SVar31 = FrConductor(auVar11._0_4_,&this->eta,&this->k);
    local_48 = SVar31.values.values._8_8_;
    local_38 = SVar31.values.values._0_8_;
    auVar29 = ZEXT816(0) << 0x40;
    fVar27 = 0.0;
    fVar30 = fVar30 * fVar30;
    auVar11 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar30)),auVar29);
    fVar12 = auVar11._0_4_ / fVar30;
    if ((ABS(fVar12) != INFINITY) && (1e-16 <= fVar30 * fVar30)) {
      auVar11 = vsqrtss_avx(auVar11,auVar11);
      auVar23._0_4_ = auVar11._0_4_;
      if ((auVar23._0_4_ != 0.0) || (NAN(auVar23._0_4_))) {
        auVar23._4_4_ = auVar23._0_4_;
        auVar23._8_4_ = auVar23._0_4_;
        auVar23._12_4_ = auVar23._0_4_;
        auVar16 = vdivps_avx(auVar16,auVar23);
        fVar27 = (this->mfDistrib).alpha_x;
        auVar5._8_4_ = 0x3f800000;
        auVar5._0_8_ = 0x3f8000003f800000;
        auVar5._12_4_ = 0x3f800000;
        uVar1 = vcmpps_avx512vl(auVar16,auVar5,0xe);
        uVar2 = vcmpss_avx512f(auVar16,SUB6416(ZEXT464(0xbf800000),0),1);
        bVar3 = (bool)((byte)uVar2 & 1);
        auVar11 = vmovshdup_avx(auVar16);
        bVar6 = (byte)(uVar1 >> 1);
        fVar25 = (float)((uint)bVar3 * -0x40800000 +
                        (uint)!bVar3 *
                        ((uint)((byte)uVar1 & 1) * 0x3f800000 +
                        (uint)!(bool)((byte)uVar1 & 1) * auVar16._0_4_));
        uVar2 = vcmpss_avx512f(auVar11,SUB6416(ZEXT464(0xbf800000),0),1);
        bVar3 = (bool)((byte)uVar2 & 1);
        fVar9 = (float)((uint)bVar3 * -0x40800000 +
                       (uint)!bVar3 *
                       ((uint)(bVar6 & 1) * 0x3f800000 + (uint)!(bool)(bVar6 & 1) * auVar11._0_4_));
        fVar25 = (fVar25 * fVar25) / (fVar27 * fVar27);
        auVar29 = ZEXT416((uint)(fVar9 * fVar9));
      }
      else {
        fVar27 = (this->mfDistrib).alpha_x;
        fVar25 = 1.0 / (fVar27 * fVar27);
      }
      fVar9 = (this->mfDistrib).alpha_y;
      fVar12 = fVar12 * (fVar25 + auVar29._0_4_ / (fVar9 * fVar9)) + 1.0;
      fVar27 = 1.0 / (fVar30 * fVar30 * fVar27 * 3.1415927 * fVar9 * fVar12 * fVar12);
    }
    uStack_40 = uVar15;
    uStack_30 = uVar28;
    FVar13 = TrowbridgeReitzDistribution::Lambda(&this->mfDistrib,(Vector3f *)&local_58);
    FVar14 = TrowbridgeReitzDistribution::Lambda(&this->mfDistrib,(Vector3f *)&local_68);
    auVar8._8_8_ = uStack_30;
    auVar8._0_8_ = local_38;
    auVar7._8_8_ = uStack_40;
    auVar7._0_8_ = local_48;
    auVar16 = vunpcklpd_avx(auVar8,auVar7);
    fVar27 = (1.0 / (FVar13 + 1.0 + FVar14)) * fVar27;
    auVar17._0_4_ = fVar27 * auVar16._0_4_;
    auVar17._4_4_ = fVar27 * auVar16._4_4_;
    auVar17._8_4_ = fVar27 * auVar16._8_4_;
    auVar17._12_4_ = fVar27 * auVar16._12_4_;
    fVar30 = (float)local_28._0_4_ * 4.0 * (float)local_18._0_4_;
    auVar21._4_4_ = fVar30;
    auVar21._0_4_ = fVar30;
    auVar21._8_4_ = fVar30;
    auVar21._12_4_ = fVar30;
    auVar16 = vdivps_avx(auVar17,auVar21);
    uVar15 = auVar16._0_8_;
    auVar16 = vshufpd_avx(auVar16,auVar16,1);
    uVar28 = auVar16._0_8_;
  }
LAB_00452676:
  SVar31.values.values[2] = (float)(int)uVar28;
  SVar31.values.values[3] = (float)(int)((ulong)uVar28 >> 0x20);
  SVar31.values.values[0] = (float)(int)uVar15;
  SVar31.values.values[1] = (float)(int)((ulong)uVar15 >> 0x20);
  return (SampledSpectrum)SVar31.values.values;
}

Assistant:

f(Vector3f wo, Vector3f wi, TransportMode mode) const {
        if (!SameHemisphere(wo, wi))
            return {};
        if (mfDistrib.EffectivelySpecular())
            return {};
        Float cosTheta_o = AbsCosTheta(wo), cosTheta_i = AbsCosTheta(wi);
        Vector3f wh = wi + wo;
        // Handle degenerate cases for microfacet reflection
        if (cosTheta_i == 0 || cosTheta_o == 0)
            return {};
        if (wh.x == 0 && wh.y == 0 && wh.z == 0)
            return {};

        wh = Normalize(wh);
        Float frCosTheta_i = AbsDot(wi, FaceForward(wh, Vector3f(0, 0, 1)));
        SampledSpectrum F = FrConductor(frCosTheta_i, eta, k);
        return mfDistrib.D(wh) * mfDistrib.G(wo, wi) * F / (4 * cosTheta_i * cosTheta_o);
    }